

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int skip_dead_code(JSFunctionDef *s,uint8_t *bc_buf,int bc_len,int pos,int *linep)

{
  byte bVar1;
  byte bVar2;
  
  if (pos < bc_len) {
    do {
      bVar1 = bc_buf[pos];
      bVar2 = opcode_info[bVar1].size;
      if (bVar1 == 0xb4) {
        if (0 < s->label_slots[*(int *)(bc_buf + (long)pos + 1)].ref_count) {
          return pos;
        }
      }
      else if (bVar1 == 0xc0) {
        *linep = *(int *)(bc_buf + (long)pos + 1);
      }
      else {
        bVar1 = opcode_info[bVar1].fmt;
        if (bVar1 < 0x1d) {
          if ((0x3800000U >> (bVar1 & 0x1f) & 1) == 0) {
            if ((0xc000000U >> (bVar1 & 0x1f) & 1) == 0) {
              if ((0x10400000U >> (bVar1 & 0x1f) & 1) != 0) {
                s->label_slots[*(int *)(bc_buf + (long)pos + 1)].ref_count =
                     s->label_slots[*(int *)(bc_buf + (long)pos + 1)].ref_count + -1;
              }
              goto LAB_0015dfff;
            }
            s->label_slots[*(int *)(bc_buf + (long)pos + 5)].ref_count =
                 s->label_slots[*(int *)(bc_buf + (long)pos + 5)].ref_count + -1;
          }
          JS_FreeAtom(s->ctx,*(JSAtom *)(bc_buf + (long)pos + 1));
        }
      }
LAB_0015dfff:
      pos = pos + (uint)bVar2;
    } while (pos < bc_len);
  }
  return pos;
}

Assistant:

static int skip_dead_code(JSFunctionDef *s, const uint8_t *bc_buf, int bc_len,
                          int pos, int *linep)
{
    int op, len, label;

    for (; pos < bc_len; pos += len) {
        op = bc_buf[pos];
        len = opcode_info[op].size;
        if (op == OP_line_num) {
            *linep = get_u32(bc_buf + pos + 1);
        } else
        if (op == OP_label) {
            label = get_u32(bc_buf + pos + 1);
            if (update_label(s, label, 0) > 0)
                break;
#if 0
            if (s->label_slots[label].first_reloc) {
                printf("line %d: unreferenced label %d:%d has relocations\n",
                       *linep, label, s->label_slots[label].pos2);
            }
#endif
            assert(s->label_slots[label].first_reloc == NULL);
        } else {
            /* XXX: output a warning for unreachable code? */
            JSAtom atom;
            switch(opcode_info[op].fmt) {
            case OP_FMT_label:
            case OP_FMT_label_u16:
                label = get_u32(bc_buf + pos + 1);
                update_label(s, label, -1);
                break;
            case OP_FMT_atom_label_u8:
            case OP_FMT_atom_label_u16:
                label = get_u32(bc_buf + pos + 5);
                update_label(s, label, -1);
                /* fall thru */
            case OP_FMT_atom:
            case OP_FMT_atom_u8:
            case OP_FMT_atom_u16:
                atom = get_u32(bc_buf + pos + 1);
                JS_FreeAtom(s->ctx, atom);
                break;
            default:
                break;
            }
        }
    }
    return pos;
}